

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_vumeter.c
# Opt level: O2

void vu_draw_new(t_vu *x,_glist *glist)

{
  _glist *in_RAX;
  _glist *p_Var1;
  int old_snd_rcv_flags;
  uint uVar2;
  char *tags [4];
  char tag_n [128];
  char tag [128];
  char tag_object [128];
  
  p_Var1 = glist_getcanvas(in_RAX);
  tags[0] = tag_object;
  tags[2] = tag_n;
  tags[3] = "text";
  tags[1] = tag;
  sprintf(tags[0],"%lxOBJ",x);
  sprintf(tag,"%lxBASE",x);
  pdgui_vmess((char *)0x0,"crr iiii rS",p_Var1,"create","rectangle",0,0,0,0,"-tags",2,tags);
  for (uVar2 = 1; uVar2 != 0x29; uVar2 = uVar2 + 1) {
    sprintf(tag,"%lxRLED",x);
    sprintf(tag_n,"%lxRLED%d",x,(ulong)uVar2);
    pdgui_vmess((char *)0x0,"crr iiii rS",p_Var1,"create","line",0,0,0,0,"-tags",3,tags);
    sprintf(tag,"%lxSCALE",x);
    sprintf(tag_n,"%lxSCALE%d",x,(ulong)uVar2);
    pdgui_vmess((char *)0x0,"crr ii rs rS",p_Var1,"create","text",0,0,"-anchor","w","-tags",3,tags);
  }
  sprintf(tag,"%lxSCALE",x);
  sprintf(tag_n,"%lxSCALE%d",x,0x29);
  pdgui_vmess((char *)0x0,"crr ii rs rS",p_Var1,"create","text",0,0,"-anchor","w","-tags",3,tags);
  sprintf(tag,"%lxRCOVER",x);
  pdgui_vmess((char *)0x0,"crr iiii rS",p_Var1,"create","rectangle",0,0,0,0,"-tags",2,tags);
  sprintf(tag,"%lxPLED",x);
  pdgui_vmess((char *)0x0,"crr iiii rS",p_Var1,"create","line",0,0,0,0,"-tags",2,tags);
  sprintf(tag,"%lxLABEL",x);
  sprintf(tag_n,"label",x);
  pdgui_vmess((char *)0x0,"crr ii rs rS",p_Var1,"create","text",0,0,"-anchor","w","-tags",4,tags);
  vu_draw_config(x,glist);
  vu_draw_io(x,glist,old_snd_rcv_flags);
  sys_queuegui(x,(x->x_gui).x_glist,vu_draw_update);
  return;
}

Assistant:

static void vu_draw_new(t_vu *x, t_glist *glist)
{
    t_canvas *canvas = glist_getcanvas(glist);
    char tag_object[128], tag[128], tag_n[128];
    char *tags[] = {tag_object, tag, tag_n, "text"};
    int i;

    sprintf(tag_object, "%lxOBJ", x);

    sprintf(tag, "%lxBASE", x);
    pdgui_vmess(0, "crr iiii rS", canvas, "create", "rectangle",
        0, 0, 0, 0, "-tags", 2, tags);

    for(i = 1; i < IEM_VU_STEPS+1; i++)
    {
        sprintf(tag, "%lxRLED", x);
        sprintf(tag_n, "%lxRLED%d", x, i);
        pdgui_vmess(0, "crr iiii rS", canvas, "create", "line",
            0, 0, 0, 0, "-tags", 3, tags);

        sprintf(tag, "%lxSCALE", x);
        sprintf(tag_n, "%lxSCALE%d", x, i);
        pdgui_vmess(0, "crr ii rs rS", canvas, "create", "text",
            0, 0, "-anchor", "w", "-tags", 3, tags);
    }
    /* and a final scale item */
    sprintf(tag, "%lxSCALE", x);
    sprintf(tag_n, "%lxSCALE%d", x, i);
    pdgui_vmess(0, "crr ii rs rS", canvas, "create", "text",
        0, 0, "-anchor", "w", "-tags", 3, tags);

    sprintf(tag, "%lxRCOVER", x);
    pdgui_vmess(0, "crr iiii rS", canvas, "create", "rectangle",
        0, 0, 0, 0, "-tags", 2, tags);

    sprintf(tag, "%lxPLED", x);
    pdgui_vmess(0, "crr iiii rS", canvas, "create", "line",
        0, 0, 0, 0, "-tags", 2, tags);

    sprintf(tag, "%lxLABEL", x);
    sprintf(tag_n, "label", x);
    pdgui_vmess(0, "crr ii rs rS", canvas, "create", "text",
        0, 0, "-anchor", "w", "-tags", 4, tags);

    vu_draw_config(x, glist);
    vu_draw_io(x, glist, 0);
    sys_queuegui(x, x->x_gui.x_glist, vu_draw_update);
}